

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

void __thiscall leveldb::Block::Iter::SeekToFirst(Iter *this)

{
  SeekToRestartPoint(this,0);
  ParseNextKey(this);
  return;
}

Assistant:

void SeekToFirst() override {
    SeekToRestartPoint(0);
    ParseNextKey();
  }